

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  LogMessage *pLVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LogFinisher local_81;
  string local_80;
  LogMessage local_60;
  ulong value;
  
  iVar2 = (*this->_vptr_MessageLite[8])();
  value = CONCAT44(extraout_var,iVar2);
  if ((value & 0xffffffff80000000) == 0) {
    iVar2 = io::CodedOutputStream::ByteCount(output);
    iVar3 = (*this->_vptr_MessageLite[0xb])(this,output->cur_,output);
    output->cur_ = (uint8_t *)CONCAT44(extraout_var_00,iVar3);
    bVar1 = io::CodedOutputStream::HadError(output);
    if (!bVar1) {
      iVar3 = io::CodedOutputStream::ByteCount(output);
      if (value != (long)(iVar3 - iVar2)) {
        iVar2 = (*this->_vptr_MessageLite[8])(this);
        if (value != CONCAT44(extraout_var_01,iVar2)) {
          internal::LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                     ,0x54);
          pLVar4 = internal::LogMessage::operator<<
                             (&local_60,
                              "CHECK failed: (byte_size_before_serialization) == (byte_size_after_serialization): "
                             );
          (*this->_vptr_MessageLite[2])(&local_80,this);
          pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_80);
          pLVar4 = internal::LogMessage::operator<<
                             (pLVar4," was modified concurrently during serialization.");
          internal::LogFinisher::operator=(&local_81,pLVar4);
          std::__cxx11::string::~string((string *)&local_80);
          internal::LogMessage::~LogMessage(&local_60);
        }
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x57);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_60,
                            "CHECK failed: (bytes_produced_by_serialization) == (byte_size_before_serialization): "
                           );
        pLVar4 = internal::LogMessage::operator<<
                           (pLVar4,
                            "Byte size calculation and serialization were inconsistent.  This may indicate a bug in protocol buffers or it may be caused by concurrent modification of "
                           );
        (*this->_vptr_MessageLite[2])(&local_80,this);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,&local_80);
        pLVar4 = internal::LogMessage::operator<<(pLVar4,".");
        internal::LogFinisher::operator=(&local_81,pLVar4);
        std::__cxx11::string::~string((string *)&local_80);
        internal::LogMessage::~LogMessage(&local_60);
        internal::LogMessage::LogMessage
                  (&local_60,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
                   ,0x5c);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_60,"This shouldn\'t be called if all the sizes are equal.");
        internal::LogFinisher::operator=((LogFinisher *)&local_80,pLVar4);
        internal::LogMessage::~LogMessage(&local_60);
      }
    }
    bVar1 = !bVar1;
  }
  else {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message_lite.cc"
               ,0x175);
    (*this->_vptr_MessageLite[2])(&local_80,this);
    pLVar4 = internal::LogMessage::operator<<(&local_60,&local_80);
    pLVar4 = internal::LogMessage::operator<<(pLVar4," exceeded maximum protobuf size of 2GB: ");
    pLVar4 = internal::LogMessage::operator<<(pLVar4,value);
    internal::LogFinisher::operator=(&local_81,pLVar4);
    std::__cxx11::string::~string((string *)&local_80);
    internal::LogMessage::~LogMessage(&local_60);
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != static_cast<int64_t>(size)) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}